

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

string * __thiscall
QPDFObjectHandle::unparseResolved_abi_cxx11_(string *__return_storage_ptr__,QPDFObjectHandle *this)

{
  bool bVar1;
  logic_error *this_00;
  QPDFObjectHandle *this_local;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if (!bVar1) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,"attempted to dereference an uninitialized QPDFObjectHandle");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  ::qpdf::BaseHandle::unparse_abi_cxx11_(__return_storage_ptr__,&this->super_BaseHandle);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFObjectHandle::unparseResolved() const
{
    if (!obj) {
        throw std::logic_error("attempted to dereference an uninitialized QPDFObjectHandle");
    }
    return BaseHandle::unparse();
}